

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QFont::Tag> * __thiscall QMap<QFont::Tag,_float>::keys(QMap<QFont::Tag,_float> *this)

{
  bool bVar1;
  QList<QFont::Tag> *in_RDI;
  
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
                      *)0x60f44d);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
                  *)0x60f476);
    QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
    ::keys((QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
            *)this);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QFont::Tag>::QList((QList<QFont::Tag> *)0x60f46a);
  }
  return in_RDI;
}

Assistant:

QList<Key> keys() const
    {
        if (!d)
            return {};
        return d->keys();
    }